

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.h
# Opt level: O1

Float __thiscall
pbrt::LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>::PDF
          (LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF> *this,Vector3f wo,
          Vector3f wi,TransportMode mode,BxDFReflTransFlags sampleFlags)

{
  long lVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  uint uVar21;
  BxDFFlags BVar22;
  byte bVar23;
  ulong uVar24;
  uint uVar25;
  TransportMode TVar26;
  undefined4 in_register_00000034;
  TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF> *pTVar27;
  ulong uVar28;
  undefined8 uVar29;
  ulong uVar30;
  bool bVar31;
  bool bVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined4 extraout_XMM0_Dc;
  undefined8 in_XMM0_Qb;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar43 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  uint in_XMM1_Db;
  uint in_XMM1_Dd;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  float fVar51;
  undefined8 in_XMM2_Qb;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [64];
  undefined4 in_XMM6_Da;
  undefined1 in_register_00001384 [12];
  Vector3f wo_00;
  Vector3f wo_01;
  Vector3f wo_02;
  Vector3f wo_03;
  Vector3f wo_04;
  Vector3f wo_05;
  Vector3f wo_06;
  Vector3f wo_07;
  Vector3f wo_08;
  Vector3f wo_09;
  Vector3f wo_10;
  Vector3f wo_11;
  Vector3f wo_12;
  Vector3f wi_00;
  Vector3f wi_01;
  Vector3f wi_02;
  Vector3f wi_03;
  Vector3f wi_04;
  Vector3f wi_05;
  Vector3f wi_06;
  Vector3f wi_07;
  TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF> rInterface;
  optional<pbrt::BSDFSample> rs;
  optional<pbrt::BSDFSample> wos;
  TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF> tInterface;
  optional<pbrt::BSDFSample> wis;
  float local_1b0;
  TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF> local_1a8;
  undefined1 local_198 [16];
  IdealDiffuseBxDF *local_180;
  undefined1 local_178 [4];
  float afStack_174 [10];
  bool local_14c;
  undefined1 local_148 [4];
  float afStack_144 [10];
  bool local_11c;
  TransportMode local_10c;
  float local_108;
  float fStack_104;
  uint uStack_100;
  uint uStack_fc;
  float local_f8;
  uint uStack_f4;
  undefined4 uStack_f0;
  uint uStack_ec;
  TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF> local_e8;
  float local_d8;
  float fStack_d4;
  uint uStack_d0;
  uint uStack_cc;
  undefined1 local_c8 [4];
  float afStack_c4 [10];
  bool local_9c;
  float local_90;
  float local_8c;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  float local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined1 local_48 [16];
  float fVar37;
  undefined4 extraout_XMM0_Db;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  
  uStack_f0 = 0;
  auVar56._4_60_ = wi._12_60_;
  auVar56._0_4_ = wi.super_Tuple3<pbrt::Vector3,_float>.z;
  local_198 = auVar56._0_16_;
  local_f8 = wo.super_Tuple3<pbrt::Vector3,_float>.z;
  local_108 = wi.super_Tuple3<pbrt::Vector3,_float>.x;
  fStack_104 = wi.super_Tuple3<pbrt::Vector3,_float>.y;
  uStack_100 = (uint)in_XMM2_Qb;
  uStack_fc = (uint)((ulong)in_XMM2_Qb >> 0x20);
  local_d8 = wo.super_Tuple3<pbrt::Vector3,_float>.x;
  fStack_d4 = wo.super_Tuple3<pbrt::Vector3,_float>.y;
  uStack_d0 = (uint)in_XMM0_Qb;
  uStack_cc = (uint)((ulong)in_XMM0_Qb >> 0x20);
  if (sampleFlags != All) {
    LogFatal<char_const(&)[39]>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/bxdfs.h"
               ,0x330,"Check failed: %s",(char (*) [39])"sampleFlags == BxDFReflTransFlags::All");
  }
  if (((this->config).twoSided != '\0') && (local_f8 < 0.0)) {
    local_d8 = -local_d8;
    fStack_d4 = -fStack_d4;
    uStack_d0 = uStack_d0 ^ 0x80000000;
    uStack_cc = uStack_cc ^ 0x80000000;
    local_f8 = -local_f8;
    in_XMM1_Db = in_XMM1_Db ^ 0x80000000;
    uStack_f0 = 0x80000000;
    in_XMM1_Dd = in_XMM1_Dd ^ 0x80000000;
    local_108 = -local_108;
    fStack_104 = -fStack_104;
    uStack_100 = uStack_100 ^ 0x80000000;
    uStack_fc = uStack_fc ^ 0x80000000;
    local_198._0_8_ = CONCAT44(wi._12_4_,auVar56._0_4_) ^ 0x8000000080000000;
    local_198._8_4_ = wi._16_4_ ^ 0x80000000;
    local_198._12_4_ = wi._20_4_ ^ 0x80000000;
  }
  uVar25 = *Options;
  wi_00.super_Tuple3<pbrt::Vector3,_float>.z = local_198._0_4_;
  local_8c = wi_00.super_Tuple3<pbrt::Vector3,_float>.z * local_f8;
  auVar56 = ZEXT1664(ZEXT816(0) << 0x40);
  local_1b0 = 0.0;
  uStack_f4 = in_XMM1_Db;
  uStack_ec = in_XMM1_Dd;
  if (0.0 < local_8c) {
    fVar51 = (float)(this->config).nSamples;
    if (local_f8 <= 0.0) {
      auVar33._8_4_ = 0x7fffffff;
      auVar33._0_8_ = 0x7fffffff7fffffff;
      auVar33._12_4_ = 0x7fffffff;
      auVar33 = vandps_avx512vl(local_198,auVar33);
      fVar37 = auVar33._0_4_ * 0.31830987;
    }
    else {
      wo_00.super_Tuple3<pbrt::Vector3,_float>.y = fStack_d4;
      wo_00.super_Tuple3<pbrt::Vector3,_float>.x = local_d8;
      local_180 = (IdealDiffuseBxDF *)CONCAT44(local_180._4_4_,fVar51);
      wi_00.super_Tuple3<pbrt::Vector3,_float>.y = fStack_104;
      wi_00.super_Tuple3<pbrt::Vector3,_float>.x = local_108;
      wo_00.super_Tuple3<pbrt::Vector3,_float>.z = local_f8;
      fVar37 = DielectricInterfaceBxDF::PDF(&this->top,wo_00,wi_00,mode,Reflection);
      fVar51 = local_180._0_4_;
    }
    local_1b0 = fVar37 * fVar51 + 0.0;
  }
  bVar23 = (this->config).nSamples;
  if (bVar23 != 0) {
    uVar24 = CONCAT44(fStack_d4,local_d8) * -0x395b586ca42e166b;
    uVar24 = (CONCAT44(in_register_00000034,local_f8) ^
             ((uVar24 >> 0x2f ^ uVar24) * -0x395b586ca42e166b ^ 0x4fb7dae84dd6f2fc) *
             -0x395b586ca42e166b) * -0x395b586ca42e166b;
    uVar28 = CONCAT44(fStack_104,local_108) * -0x395b586ca42e166b;
    uVar24 = (uVar24 >> 0x2f ^ uVar24) * -0x395b586ca42e166b;
    uVar24 = (uVar25 & 0xffffff ^ uVar24 ^ 0x1a929e4d6f47a654 ^
             (uVar24 >> 0x2f | (ulong)(uVar25 & 0xff000000))) * -0x395b586ca42e166b;
    uVar28 = (CONCAT44(0x4fb7dae8,local_198._0_4_) ^
             ((uVar28 >> 0x2f ^ uVar28) * -0x395b586ca42e166b ^ 0x4fb7dae84dd6f2fc) *
             -0x395b586ca42e166b) * -0x395b586ca42e166b;
    uVar24 = (uVar24 >> 0x2f ^ uVar24) * -0x395b586ca42e166b;
    uVar28 = (uVar28 >> 0x2f ^ uVar28) * -0x395b586ca42e166b;
    uVar24 = uVar24 >> 0x2f ^ uVar24;
    lVar1 = uVar24 * 2 + 1;
    uVar24 = ((uVar28 >> 0x2f ^ uVar28) + 1) * 0x5851f42d4c957f2d + uVar24 * -0x4f5c17a566d501a4 + 1
    ;
    local_180 = &this->bottom;
    local_10c = (TransportMode)(mode == Radiance);
    auVar35._8_4_ = 0x7fffffff;
    auVar35._0_8_ = 0x7fffffff7fffffff;
    auVar35._12_4_ = 0x7fffffff;
    auVar33 = vandps_avx512vl(local_198,auVar35);
    local_88 = ZEXT416((uint)(auVar33._0_4_ * 0.31830987));
    uVar25 = 0;
    do {
      auVar33 = auVar56._0_16_;
      bVar23 = (byte)(uVar24 >> 0x38);
      uVar21 = (uint)(uVar24 >> 0x20);
      if (local_8c <= 0.0) {
        if (local_f8 <= 0.0) {
          afStack_174[1] = SUB84(local_180,0);
          afStack_174[2] = (float)((ulong)local_180 >> 0x20);
          _local_178 = (LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF> *)0x0;
          local_1a8.bottom = (IdealDiffuseBxDF *)0x0;
          local_1a8.top = &this->top;
        }
        else {
          afStack_174[1] = 0.0;
          afStack_174[2] = 0.0;
          auVar34._8_8_ = 0;
          auVar34._0_8_ = local_180;
          local_1a8 = (TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>)
                      (auVar34 << 0x40);
          _local_178 = this;
        }
        uVar21 = uVar21 >> 0xd ^ (uint)(uVar24 >> 0x1b);
        bVar23 = bVar23 >> 3;
        auVar17._4_12_ = in_register_00001384;
        auVar17._0_4_ = in_XMM6_Da;
        auVar35 = vcvtusi2ss_avx512f(auVar17,uVar21 >> bVar23 | uVar21 << 0x20 - bVar23);
        auVar35 = vminss_avx(ZEXT416((uint)(auVar35._0_4_ * 2.3283064e-10)),ZEXT416(0x3f7fffff));
        uVar28 = uVar24 * 0x5851f42d4c957f2d + lVar1;
        uVar30 = uVar28 * 0x5851f42d4c957f2d + lVar1;
        uVar24 = uVar30 * 0x5851f42d4c957f2d + lVar1;
        auVar41._8_8_ = 0;
        auVar41._0_8_ = uVar28;
        auVar48._8_8_ = 0;
        auVar48._0_8_ = uVar30;
        auVar39 = vpunpcklqdq_avx(auVar41,auVar48);
        auVar34 = vpsrlvq_avx2(auVar39,_DAT_0045e970);
        auVar2 = vpsrlvq_avx2(auVar39,_DAT_0045e980);
        auVar34 = vpshufd_avx(auVar34 ^ auVar2,0xe8);
        auVar39 = vpsrlq_avx(auVar39,0x3b);
        auVar39 = vpshufd_avx(auVar39,0xe8);
        auVar34 = vprorvd_avx512vl(auVar34,auVar39);
        auVar34 = vcvtudq2ps_avx512vl(auVar34);
        auVar39._8_4_ = 0x2f800000;
        auVar39._0_8_ = 0x2f8000002f800000;
        auVar39._12_4_ = 0x2f800000;
        auVar34 = vmulps_avx512vl(auVar34,auVar39);
        auVar2._8_4_ = 0x3f7fffff;
        auVar2._0_8_ = 0x3f7fffff3f7fffff;
        auVar2._12_4_ = 0x3f7fffff;
        auVar34 = vminps_avx512vl(auVar34,auVar2);
        wo_04.super_Tuple3<pbrt::Vector3,_float>.y = fStack_d4;
        wo_04.super_Tuple3<pbrt::Vector3,_float>.x = local_d8;
        auVar56 = ZEXT1664(auVar33);
        wo_04.super_Tuple3<pbrt::Vector3,_float>.z = local_f8;
        TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>::Sample_f
                  ((optional<pbrt::BSDFSample> *)local_148,
                   (TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF> *)
                   local_178,wo_04,auVar35._0_4_,(Point2f)auVar34._0_8_,mode,All);
        if (local_11c == true) {
          if (((float)local_148 == 0.0) && (!NAN((float)local_148))) {
            uVar28 = 0;
            while (uVar30 = uVar28, uVar30 != 3) {
              if ((*(float *)(local_148 + uVar30 * 4 + 4) != 0.0) ||
                 (uVar28 = uVar30 + 1, NAN(*(float *)(local_148 + uVar30 * 4 + 4)))) break;
            }
            if (2 < uVar30) goto LAB_004202c2;
          }
          if ((((afStack_144[6] != 0.0) || (NAN(afStack_144[6]))) &&
              ((afStack_144[5] != 0.0 || (NAN(afStack_144[5]))))) &&
             (((uint)afStack_144[7] & 1) == 0)) {
            uVar21 = (uint)(uVar24 >> 0x2d) ^ (uint)(uVar24 >> 0x1b);
            bVar23 = (byte)(uVar24 >> 0x3b);
            auVar18._4_12_ = in_register_00001384;
            auVar18._0_4_ = in_XMM6_Da;
            auVar33 = vcvtusi2ss_avx512f(auVar18,uVar21 >> bVar23 | uVar21 << 0x20 - bVar23);
            auVar33 = vminss_avx(ZEXT416((uint)(auVar33._0_4_ * 2.3283064e-10)),ZEXT416(0x3f7fffff))
            ;
            uVar24 = uVar24 * 0x5851f42d4c957f2d + lVar1;
            uVar28 = uVar24 * 0x5851f42d4c957f2d + lVar1;
            auVar42._8_8_ = 0;
            auVar42._0_8_ = uVar24;
            auVar49._8_8_ = 0;
            auVar49._0_8_ = uVar28;
            auVar34 = vpunpcklqdq_avx(auVar42,auVar49);
            auVar35 = vpsrlvq_avx2(auVar34,_DAT_0045e970);
            auVar39 = vpsrlvq_avx2(auVar34,_DAT_0045e980);
            auVar35 = vpshufd_avx(auVar35 ^ auVar39,0xe8);
            auVar34 = vpsrlq_avx(auVar34,0x3b);
            auVar34 = vpshufd_avx(auVar34,0xe8);
            auVar35 = vprorvd_avx512vl(auVar35,auVar34);
            auVar35 = vcvtudq2ps_avx512vl(auVar35);
            auVar11._8_4_ = 0x2f800000;
            auVar11._0_8_ = 0x2f8000002f800000;
            auVar11._12_4_ = 0x2f800000;
            auVar35 = vmulps_avx512vl(auVar35,auVar11);
            auVar12._8_4_ = 0x3f7fffff;
            auVar12._0_8_ = 0x3f7fffff3f7fffff;
            auVar12._12_4_ = 0x3f7fffff;
            auVar35 = vminps_avx512vl(auVar35,auVar12);
            pTVar27 = &local_1a8;
            wo_05.super_Tuple3<pbrt::Vector3,_float>.y = fStack_104;
            wo_05.super_Tuple3<pbrt::Vector3,_float>.x = local_108;
            wo_05.super_Tuple3<pbrt::Vector3,_float>.z = (float)local_198._0_4_;
            TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>::Sample_f
                      ((optional<pbrt::BSDFSample> *)local_c8,pTVar27,wo_05,auVar33._0_4_,
                       (Point2f)auVar35._0_8_,local_10c,All);
            TVar26 = (TransportMode)pTVar27;
            if (local_9c == true) {
              if (local_11c != true) goto LAB_00420340;
              if (((float)local_148 != 0.0) || (NAN((float)local_148))) {
                bVar32 = false;
              }
              else {
                uVar24 = 0;
                while (uVar30 = uVar24, uVar30 != 3) {
                  if ((*(float *)(local_148 + uVar30 * 4 + 4) != 0.0) ||
                     (uVar24 = uVar30 + 1, NAN(*(float *)(local_148 + uVar30 * 4 + 4)))) break;
                }
                bVar32 = 2 < uVar30;
              }
              if ((((!bVar32) && ((afStack_144[6] != 0.0 || (NAN(afStack_144[6]))))) &&
                  ((afStack_144[5] != 0.0 || (NAN(afStack_144[5]))))) &&
                 (((uint)afStack_c4[7] & 1) == 0)) {
                BVar22 = TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>::
                         Flags((TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>
                                *)local_178);
                if ((BVar22 & Specular) == Unset) {
                  BVar22 = TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>::
                           Flags(&local_1a8);
                  if ((BVar22 & Specular) == Unset) {
                    if (local_9c == false) {
LAB_00420340:
                      LogFatal<char_const(&)[4]>
                                (Fatal,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                                 ,0xea,"Check failed: %s",(char (*) [4])0x287813c);
                    }
                    wi_02.super_Tuple3<pbrt::Vector3,_float>.z = -afStack_c4[5];
                    if ((LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF> *)
                        _local_178 ==
                        (LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF> *)0x0) {
                      auVar13._8_4_ = 0x7fffffff;
                      auVar13._0_8_ = 0x7fffffff7fffffff;
                      auVar13._12_4_ = 0x7fffffff;
                      auVar33 = vandps_avx512vl(ZEXT416((uint)afStack_c4[5]),auVar13);
                      uVar29 = vcmpss_avx512f(ZEXT416((uint)(wi_02.
                                                  super_Tuple3<pbrt::Vector3,_float>.z * local_f8)),
                                              ZEXT416(0),0xe);
                      local_78 = ZEXT416((uint)((byte)uVar29 & 1) *
                                         (int)(auVar33._0_4_ * 0.31830987));
                    }
                    else {
                      wi_02.super_Tuple3<pbrt::Vector3,_float>._0_8_ =
                           CONCAT44(afStack_c4[4],afStack_c4[3]) ^ 0x8000000080000000;
                      wo_07.super_Tuple3<pbrt::Vector3,_float>.y = fStack_d4;
                      wo_07.super_Tuple3<pbrt::Vector3,_float>.x = local_d8;
                      wo_07.super_Tuple3<pbrt::Vector3,_float>.z = local_f8;
                      local_78._0_4_ =
                           DielectricInterfaceBxDF::PDF
                                     ((DielectricInterfaceBxDF *)_local_178,wo_07,wi_02,TVar26,All);
                      local_78._4_4_ = extraout_XMM0_Db;
                      local_78._8_4_ = extraout_XMM0_Dc;
                      local_78._12_4_ = extraout_XMM0_Dd;
                    }
                    if (local_11c != true) goto LAB_00420340;
                    wo_12.super_Tuple3<pbrt::Vector3,_float>.z = -afStack_144[5];
                    if (local_1a8.top == (DielectricInterfaceBxDF *)0x0) {
                      uVar29 = vcmpss_avx512f(ZEXT416((uint)(wo_12.
                                                  super_Tuple3<pbrt::Vector3,_float>.z *
                                                  (float)local_198._0_4_)),ZEXT416(0),0xe);
                      fVar51 = (float)((uint)((byte)uVar29 & 1) * local_88._0_4_);
                    }
                    else {
                      wo_12.super_Tuple3<pbrt::Vector3,_float>._0_8_ =
                           CONCAT44(afStack_144[4],afStack_144[3]) ^ 0x8000000080000000;
                      wi_07.super_Tuple3<pbrt::Vector3,_float>.y = fStack_104;
                      wi_07.super_Tuple3<pbrt::Vector3,_float>.x = local_108;
                      wi_07.super_Tuple3<pbrt::Vector3,_float>.z = (float)local_198._0_4_;
                      fVar51 = DielectricInterfaceBxDF::PDF(local_1a8.top,wo_12,wi_07,TVar26,All);
                    }
                    fVar51 = (fVar51 + (float)local_78._0_4_) * 0.5;
                  }
                  else {
                    if (local_9c == false) goto LAB_00420340;
                    if ((LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF> *)
                        _local_178 ==
                        (LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF> *)0x0) {
                      auVar14._8_4_ = 0x7fffffff;
                      auVar14._0_8_ = 0x7fffffff7fffffff;
                      auVar14._12_4_ = 0x7fffffff;
                      auVar33 = vandps_avx512vl(ZEXT416((uint)afStack_c4[5]),auVar14);
                      uVar29 = vcmpss_avx512f(ZEXT416((uint)(-afStack_c4[5] * local_f8)),ZEXT416(0),
                                              0xe);
                      bVar23 = (byte)uVar29;
                      fVar51 = auVar33._0_4_ * 0.31830987;
                      goto LAB_0042025a;
                    }
                    auVar52._0_8_ = CONCAT44(afStack_c4[4],afStack_c4[3]) ^ 0x8000000080000000;
                    auVar52._8_4_ = 0x80000000;
                    auVar52._12_4_ = 0x80000000;
                    auVar43._4_4_ = fStack_d4;
                    auVar43._0_4_ = local_d8;
                    auVar43._8_4_ = uStack_d0;
                    auVar43._12_4_ = uStack_cc;
                    uVar29 = _local_178;
                    fVar51 = local_f8;
                    fVar37 = -afStack_c4[5];
LAB_0042001e:
                    wo_10.super_Tuple3<pbrt::Vector3,_float>._0_8_ = auVar43._0_8_;
                    wo_10.super_Tuple3<pbrt::Vector3,_float>.z = fVar51;
                    wi_05.super_Tuple3<pbrt::Vector3,_float>._0_8_ = auVar52._0_8_;
                    wi_05.super_Tuple3<pbrt::Vector3,_float>.z = fVar37;
                    fVar51 = DielectricInterfaceBxDF::PDF
                                       ((DielectricInterfaceBxDF *)uVar29,wo_10,wi_05,TVar26,All);
                  }
                }
                else {
                  if (local_11c != true) goto LAB_00420340;
                  fVar51 = -afStack_144[5];
                  if ((LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF> *)
                      local_1a8.top !=
                      (LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF> *)0x0) {
                    auVar43._0_8_ = CONCAT44(afStack_144[4],afStack_144[3]) ^ 0x8000000080000000;
                    auVar43._8_4_ = 0x80000000;
                    auVar43._12_4_ = 0x80000000;
                    auVar52._4_4_ = fStack_104;
                    auVar52._0_4_ = local_108;
                    auVar52._8_4_ = uStack_100;
                    auVar52._12_4_ = uStack_fc;
                    uVar29 = local_1a8.top;
                    fVar37 = (float)local_198._0_4_;
                    goto LAB_0042001e;
                  }
                  uVar29 = vcmpss_avx512f(ZEXT416((uint)(fVar51 * (float)local_198._0_4_)),
                                          ZEXT416(0),0xe);
                  bVar23 = (byte)uVar29;
                  fVar51 = (float)local_88._0_4_;
LAB_0042025a:
                  fVar51 = (float)((uint)(bVar23 & 1) * (int)fVar51);
                }
                local_1b0 = local_1b0 + fVar51;
              }
            }
            if (local_9c == true) {
              local_9c = false;
            }
            uVar24 = uVar28 * 0x5851f42d4c957f2d + lVar1;
          }
        }
LAB_004202c2:
        if (local_11c == true) {
          local_11c = false;
        }
      }
      else {
        if (local_f8 <= 0.0) {
          local_1a8.bottom = (IdealDiffuseBxDF *)0x0;
          local_1a8.top = &this->top;
          auVar20._8_8_ = 0;
          auVar20._0_8_ = local_180;
          local_e8 = (TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>)
                     (auVar20 << 0x40);
        }
        else {
          auVar19._8_8_ = 0;
          auVar19._0_8_ = local_180;
          local_1a8 = (TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>)
                      (auVar19 << 0x40);
          local_e8.bottom = (IdealDiffuseBxDF *)0x0;
          local_e8.top = &this->top;
        }
        local_11c = false;
        local_9c = false;
        uVar21 = uVar21 >> 0xd ^ (uint)(uVar24 >> 0x1b);
        bVar23 = bVar23 >> 3;
        auVar15._4_12_ = in_register_00001384;
        auVar15._0_4_ = in_XMM6_Da;
        auVar35 = vcvtusi2ss_avx512f(auVar15,uVar21 >> bVar23 | uVar21 << 0x20 - bVar23);
        auVar35 = vminss_avx(ZEXT416((uint)(auVar35._0_4_ * 2.3283064e-10)),ZEXT416(0x3f7fffff));
        uVar24 = uVar24 * 0x5851f42d4c957f2d + lVar1;
        uVar28 = uVar24 * 0x5851f42d4c957f2d + lVar1;
        auVar38._8_8_ = 0;
        auVar38._0_8_ = uVar24;
        auVar46._8_8_ = 0;
        auVar46._0_8_ = uVar28;
        auVar39 = vpunpcklqdq_avx(auVar38,auVar46);
        auVar34 = vpsrlvq_avx2(auVar39,_DAT_0045e970);
        auVar2 = vpsrlvq_avx2(auVar39,_DAT_0045e980);
        auVar34 = vpshufd_avx(auVar34 ^ auVar2,0xe8);
        auVar39 = vpsrlq_avx(auVar39,0x3b);
        auVar39 = vpshufd_avx(auVar39,0xe8);
        auVar34 = vprorvd_avx512vl(auVar34,auVar39);
        auVar34 = vcvtudq2ps_avx512vl(auVar34);
        auVar3._8_4_ = 0x2f800000;
        auVar3._0_8_ = 0x2f8000002f800000;
        auVar3._12_4_ = 0x2f800000;
        auVar34 = vmulps_avx512vl(auVar34,auVar3);
        auVar4._8_4_ = 0x3f7fffff;
        auVar4._0_8_ = 0x3f7fffff3f7fffff;
        auVar4._12_4_ = 0x3f7fffff;
        auVar34 = vminps_avx512vl(auVar34,auVar4);
        wo_01.super_Tuple3<pbrt::Vector3,_float>.y = fStack_d4;
        wo_01.super_Tuple3<pbrt::Vector3,_float>.x = local_d8;
        wo_01.super_Tuple3<pbrt::Vector3,_float>.z = local_f8;
        TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>::Sample_f
                  ((optional<pbrt::BSDFSample> *)local_178,&local_e8,wo_01,auVar35._0_4_,
                   (Point2f)auVar34._0_8_,mode,Transmission);
        if (local_14c == true) {
          _local_148 = _local_178;
          afStack_144[7] = afStack_174[7];
          afStack_144[8] = afStack_174[8];
          afStack_144[9] = afStack_174[9];
          afStack_144[1] = afStack_174[1];
          afStack_144[2] = afStack_174[2];
          afStack_144[3] = afStack_174[3];
          afStack_144[4] = afStack_174[4];
          afStack_144[5] = afStack_174[5];
          afStack_144[6] = afStack_174[6];
          local_11c = true;
          local_14c = false;
        }
        if (local_14c == true) {
          local_14c = false;
        }
        uVar24 = uVar28 * 0x5851f42d4c957f2d + lVar1;
        uVar21 = (uint)(uVar24 >> 0x2d) ^ (uint)(uVar24 >> 0x1b);
        bVar23 = (byte)(uVar24 >> 0x3b);
        auVar16._4_12_ = in_register_00001384;
        auVar16._0_4_ = in_XMM6_Da;
        auVar35 = vcvtusi2ss_avx512f(auVar16,uVar21 >> bVar23 | uVar21 << 0x20 - bVar23);
        auVar35 = vminss_avx(ZEXT416((uint)(auVar35._0_4_ * 2.3283064e-10)),ZEXT416(0x3f7fffff));
        uVar24 = uVar24 * 0x5851f42d4c957f2d + lVar1;
        uVar28 = uVar24 * 0x5851f42d4c957f2d + lVar1;
        auVar40._8_8_ = 0;
        auVar40._0_8_ = uVar24;
        auVar47._8_8_ = 0;
        auVar47._0_8_ = uVar28;
        auVar39 = vpunpcklqdq_avx(auVar40,auVar47);
        auVar34 = vpsrlvq_avx2(auVar39,_DAT_0045e970);
        auVar2 = vpsrlvq_avx2(auVar39,_DAT_0045e980);
        auVar34 = vpshufd_avx(auVar34 ^ auVar2,0xe8);
        auVar39 = vpsrlq_avx(auVar39,0x3b);
        auVar39 = vpshufd_avx(auVar39,0xe8);
        auVar34 = vprorvd_avx512vl(auVar34,auVar39);
        auVar34 = vcvtudq2ps_avx512vl(auVar34);
        auVar5._8_4_ = 0x2f800000;
        auVar5._0_8_ = 0x2f8000002f800000;
        auVar5._12_4_ = 0x2f800000;
        auVar34 = vmulps_avx512vl(auVar34,auVar5);
        auVar6._8_4_ = 0x3f7fffff;
        auVar6._0_8_ = 0x3f7fffff3f7fffff;
        auVar6._12_4_ = 0x3f7fffff;
        auVar34 = vminps_avx512vl(auVar34,auVar6);
        pTVar27 = &local_e8;
        wo_02.super_Tuple3<pbrt::Vector3,_float>.y = fStack_104;
        wo_02.super_Tuple3<pbrt::Vector3,_float>.x = local_108;
        auVar56 = ZEXT1664(auVar33);
        wo_02.super_Tuple3<pbrt::Vector3,_float>.z = (float)local_198._0_4_;
        TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>::Sample_f
                  ((optional<pbrt::BSDFSample> *)local_178,pTVar27,wo_02,auVar35._0_4_,
                   (Point2f)auVar34._0_8_,local_10c,Transmission);
        bVar32 = local_11c;
        TVar26 = (TransportMode)pTVar27;
        if (local_14c == true) {
          _local_c8 = _local_178;
          afStack_c4[7] = afStack_174[7];
          afStack_c4[8] = afStack_174[8];
          afStack_c4[9] = afStack_174[9];
          afStack_c4[1] = afStack_174[1];
          afStack_c4[2] = afStack_174[2];
          afStack_c4[3] = afStack_174[3];
          afStack_c4[4] = afStack_174[4];
          afStack_c4[5] = afStack_174[5];
          afStack_c4[6] = afStack_174[6];
          local_9c = true;
          local_14c = false;
        }
        if (local_14c == true) {
          local_14c = false;
        }
        uVar24 = uVar28 * 0x5851f42d4c957f2d + lVar1;
        if (local_11c == true) {
          bVar31 = true;
          if (((float)local_148 == 0.0) && (!NAN((float)local_148))) {
            uVar28 = 0;
            while (uVar30 = uVar28, uVar30 != 3) {
              if ((*(float *)(local_148 + uVar30 * 4 + 4) != 0.0) ||
                 (uVar28 = uVar30 + 1, NAN(*(float *)(local_148 + uVar30 * 4 + 4)))) break;
            }
            bVar31 = uVar30 < 3;
          }
          if (((bVar31) && (0.0 < afStack_144[6])) && (local_9c == true)) {
            if (((float)local_c8 == 0.0) && (!NAN((float)local_c8))) {
              uVar28 = 0;
              while (uVar30 = uVar28, uVar30 != 3) {
                if ((*(float *)(local_c8 + uVar30 * 4 + 4) != 0.0) ||
                   (uVar28 = uVar30 + 1, NAN(*(float *)(local_c8 + uVar30 * 4 + 4)))) break;
              }
              if (2 < uVar30) goto LAB_00420179;
            }
            local_78._0_4_ = afStack_c4[6];
            if (0.0 < afStack_c4[6]) {
              auVar56 = ZEXT1664(auVar56._0_16_);
              bVar31 = TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>::
                       IsNonSpecular(&local_e8);
              if (bVar31) {
                local_48._0_8_ = CONCAT44(afStack_144[4],afStack_144[3]) ^ 0x8000000080000000;
                local_48._8_4_ = 0x80000000;
                local_48._12_4_ = 0x80000000;
                local_68 = ZEXT416((uint)afStack_144[5]);
                wo_03.super_Tuple3<pbrt::Vector3,_float>.z = -afStack_144[5];
                uVar21 = (uint)(uVar24 >> 0x2d) ^ (uint)(uVar24 >> 0x1b);
                bVar23 = (byte)(uVar24 >> 0x3b);
                auVar33 = vcvtusi2ss_avx512f(auVar56._0_16_,
                                             uVar21 >> bVar23 | uVar21 << 0x20 - bVar23);
                auVar33 = vminss_avx(ZEXT416((uint)(auVar33._0_4_ * 2.3283064e-10)),
                                     ZEXT416(0x3f7fffff));
                uVar24 = uVar24 * 0x5851f42d4c957f2d + lVar1;
                uVar28 = uVar24 * 0x5851f42d4c957f2d + lVar1;
                auVar54._8_8_ = 0;
                auVar54._0_8_ = uVar24;
                auVar55._8_8_ = 0;
                auVar55._0_8_ = uVar28;
                auVar34 = vpunpcklqdq_avx(auVar54,auVar55);
                auVar56 = ZEXT1664(auVar34);
                auVar35 = vpsrlvq_avx2(auVar34,_DAT_0045e970);
                auVar39 = vpsrlvq_avx2(auVar34,_DAT_0045e980);
                auVar35 = vpshufd_avx(auVar35 ^ auVar39,0xe8);
                auVar34 = vpsrlq_avx(auVar34,0x3b);
                auVar34 = vpshufd_avx(auVar34,0xe8);
                auVar35 = vprorvd_avx512vl(auVar35,auVar34);
                auVar35 = vcvtudq2ps_avx512vl(auVar35);
                auVar7._8_4_ = 0x2f800000;
                auVar7._0_8_ = 0x2f8000002f800000;
                auVar7._12_4_ = 0x2f800000;
                auVar35 = vmulps_avx512vl(auVar35,auVar7);
                auVar8._8_4_ = 0x3f7fffff;
                auVar8._0_8_ = 0x3f7fffff3f7fffff;
                auVar8._12_4_ = 0x3f7fffff;
                auVar35 = vminps_avx512vl(auVar35,auVar8);
                pTVar27 = &local_1a8;
                uStack_54 = 0x80000000;
                uStack_50 = 0x80000000;
                uStack_4c = 0x80000000;
                wo_03.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)local_48._0_8_;
                wo_03.super_Tuple3<pbrt::Vector3,_float>.y =
                     (float)(int)((ulong)local_48._0_8_ >> 0x20);
                local_58 = wo_03.super_Tuple3<pbrt::Vector3,_float>.z;
                TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>::Sample_f
                          ((optional<pbrt::BSDFSample> *)local_178,pTVar27,wo_03,auVar33._0_4_,
                           (Point2f)auVar35._0_8_,mode,All);
                TVar26 = (TransportMode)pTVar27;
                if (local_14c == true) {
                  if (((float)local_178 == 0.0) && (!NAN((float)local_178))) {
                    uVar24 = 0;
                    while (uVar30 = uVar24, uVar30 != 3) {
                      if ((*(float *)(local_178 + uVar30 * 4 + 4) != 0.0) ||
                         (uVar24 = uVar30 + 1, NAN(*(float *)(local_178 + uVar30 * 4 + 4)))) break;
                    }
                    if (2 < uVar30) goto LAB_00420166;
                  }
                  if ((afStack_174[6] != 0.0) || (NAN(afStack_174[6]))) {
                    bVar31 = TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>
                             ::IsNonSpecular(&local_1a8);
                    if (bVar31) {
                      if (local_14c == false) {
                        LogFatal<char_const(&)[4]>
                                  (Fatal,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                                   ,0xea,"Check failed: %s",(char (*) [4])0x287813c);
                      }
                      wo_08.super_Tuple3<pbrt::Vector3,_float>.z = -afStack_174[5];
                      if (local_e8.top == (DielectricInterfaceBxDF *)0x0) {
                        uVar29 = vcmpss_avx512f(ZEXT416((uint)(wo_08.
                                                  super_Tuple3<pbrt::Vector3,_float>.z *
                                                  (float)local_198._0_4_)),ZEXT416(0),0xe);
                        auVar36._4_12_ = local_88._4_12_;
                        auVar36._0_4_ = (uint)((byte)uVar29 & 1) * local_88._0_4_;
                      }
                      else {
                        wo_08.super_Tuple3<pbrt::Vector3,_float>._0_8_ =
                             CONCAT44(afStack_174[4],afStack_174[3]) ^ 0x8000000080000000;
                        wi_03.super_Tuple3<pbrt::Vector3,_float>.y = fStack_104;
                        wi_03.super_Tuple3<pbrt::Vector3,_float>.x = local_108;
                        wi_03.super_Tuple3<pbrt::Vector3,_float>.z = (float)local_198._0_4_;
                        auVar44._0_4_ =
                             DielectricInterfaceBxDF::PDF(local_e8.top,wo_08,wi_03,TVar26,All);
                        auVar44._4_60_ = extraout_var;
                        auVar36 = auVar44._0_16_;
                      }
                      auVar33 = local_48;
                      if (local_14c == false) {
                        LogFatal<char_const(&)[4]>
                                  (Fatal,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                                   ,0xea,"Check failed: %s",(char (*) [4])0x287813c);
                      }
                      if (local_1a8.top == (DielectricInterfaceBxDF *)0x0) {
                        auVar9._8_4_ = 0x7fffffff;
                        auVar9._0_8_ = 0x7fffffff7fffffff;
                        auVar9._12_4_ = 0x7fffffff;
                        auVar33 = vandps_avx512vl(ZEXT416((uint)afStack_c4[5]),auVar9);
                        uVar29 = vcmpss_avx512f(ZEXT416((uint)(afStack_c4[5] * (float)local_68._0_4_
                                                              )),ZEXT416(0),0xe);
                        auVar33 = ZEXT416((uint)((byte)uVar29 & 1) *
                                          (int)(auVar33._0_4_ * 0.31830987));
                        fVar51 = afStack_174[6];
                      }
                      else {
                        local_90 = afStack_174[6];
                        wi_06.super_Tuple3<pbrt::Vector3,_float>.z = -afStack_c4[5];
                        wi_06.super_Tuple3<pbrt::Vector3,_float>._0_8_ =
                             CONCAT44(afStack_c4[4],afStack_c4[3]) ^ 0x8000000080000000;
                        wo_11.super_Tuple3<pbrt::Vector3,_float>.z = local_58;
                        wo_11.super_Tuple3<pbrt::Vector3,_float>.x = (float)local_48._0_4_;
                        wo_11.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_48._4_4_;
                        local_68 = auVar36;
                        local_48 = auVar33;
                        auVar45._0_4_ =
                             DielectricInterfaceBxDF::PDF(local_1a8.top,wo_11,wi_06,TVar26,All);
                        auVar45._4_60_ = extraout_var_00;
                        auVar33 = auVar45._0_16_;
                        fVar51 = local_90;
                        auVar36 = local_68;
                      }
                      auVar50._0_4_ =
                           (fVar51 * fVar51) / (auVar36._0_4_ * auVar36._0_4_ + fVar51 * fVar51);
                      auVar50._4_12_ = SUB6012((undefined1  [60])0x0,0);
                      auVar35 = vfmadd213ss_fma(auVar50,auVar36,ZEXT416((uint)local_1b0));
                      auVar53._0_4_ =
                           ((float)local_78._0_4_ * (float)local_78._0_4_) /
                           ((float)local_78._0_4_ * (float)local_78._0_4_ +
                           auVar33._0_4_ * auVar33._0_4_);
                      auVar53._4_12_ = SUB6012((undefined1  [60])0x0,0);
                      auVar33 = vfmadd213ss_fma(auVar53,auVar33,auVar35);
                      local_1b0 = auVar33._0_4_;
                    }
                    else {
                      if (local_14c == false) {
                        LogFatal<char_const(&)[4]>
                                  (Fatal,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                                   ,0xea,"Check failed: %s",(char (*) [4])0x287813c);
                      }
                      wo_09.super_Tuple3<pbrt::Vector3,_float>.z = -afStack_174[5];
                      if (local_e8.top == (DielectricInterfaceBxDF *)0x0) {
                        uVar29 = vcmpss_avx512f(ZEXT416((uint)(wo_09.
                                                  super_Tuple3<pbrt::Vector3,_float>.z *
                                                  (float)local_198._0_4_)),ZEXT416(0),0xe);
                        fVar51 = (float)((uint)((byte)uVar29 & 1) * local_88._0_4_);
                      }
                      else {
                        wo_09.super_Tuple3<pbrt::Vector3,_float>._0_8_ =
                             CONCAT44(afStack_174[4],afStack_174[3]) ^ 0x8000000080000000;
                        wi_04.super_Tuple3<pbrt::Vector3,_float>.y = fStack_104;
                        wi_04.super_Tuple3<pbrt::Vector3,_float>.x = local_108;
                        wi_04.super_Tuple3<pbrt::Vector3,_float>.z = (float)local_198._0_4_;
                        fVar51 = DielectricInterfaceBxDF::PDF(local_e8.top,wo_09,wi_04,TVar26,All);
                      }
                      local_1b0 = local_1b0 + fVar51;
                    }
                  }
                }
LAB_00420166:
                if (local_14c == true) {
                  local_14c = false;
                }
                uVar24 = uVar28 * 0x5851f42d4c957f2d + lVar1;
              }
              else {
                if (local_1a8.top == (DielectricInterfaceBxDF *)0x0) {
                  auVar10._8_4_ = 0x7fffffff;
                  auVar10._0_8_ = 0x7fffffff7fffffff;
                  auVar10._12_4_ = 0x7fffffff;
                  auVar33 = vandps_avx512vl(ZEXT416((uint)afStack_c4[5]),auVar10);
                  uVar29 = vcmpss_avx512f(ZEXT416((uint)(afStack_144[5] * afStack_c4[5])),ZEXT416(0)
                                          ,0xe);
                  fVar51 = (float)((uint)((byte)uVar29 & 1) * (int)(auVar33._0_4_ * 0.31830987));
                }
                else {
                  wi_01.super_Tuple3<pbrt::Vector3,_float>.z = -afStack_c4[5];
                  wo_06.super_Tuple3<pbrt::Vector3,_float>.z = -afStack_144[5];
                  wo_06.super_Tuple3<pbrt::Vector3,_float>._0_8_ =
                       CONCAT44(afStack_144[4],afStack_144[3]) ^ 0x8000000080000000;
                  wi_01.super_Tuple3<pbrt::Vector3,_float>._0_8_ =
                       CONCAT44(afStack_c4[4],afStack_c4[3]) ^ 0x8000000080000000;
                  fVar51 = DielectricInterfaceBxDF::PDF(local_1a8.top,wo_06,wi_01,TVar26,All);
                }
                local_1b0 = local_1b0 + fVar51;
              }
            }
          }
        }
LAB_00420179:
        if (bVar32 != false) {
          local_11c = false;
        }
      }
      uVar25 = uVar25 + 1;
      bVar23 = (this->config).nSamples;
    } while (uVar25 < bVar23);
  }
  return (local_1b0 / (float)bVar23) * 0.9 + 0.007957749;
}

Assistant:

PBRT_CPU_GPU
    Float PDF(Vector3f wo, Vector3f wi, TransportMode mode,
              BxDFReflTransFlags sampleFlags = BxDFReflTransFlags::All) const {
        CHECK(sampleFlags == BxDFReflTransFlags::All);  // for now
        // Return approximate PDF for layered BSDF
        // Set _wi_ and _wi_ for layered BSDF evaluation
        if (config.twoSided && wo.z < 0) {
            wo = -wo;
            wi = -wi;
        }

        // Declare _RNG_ for layered BSDF evaluation
        RNG rng(Hash(GetOptions().seed, wo), Hash(wi));
        auto r = [&rng]() {
            return std::min<Float>(rng.Uniform<Float>(), OneMinusEpsilon);
        };

        // Update _pdfSum_ for reflection at the entrance layer
        bool enteredTop = wo.z > 0;
        Float pdfSum = 0;
        if (SameHemisphere(wo, wi)) {
            auto reflFlag = BxDFReflTransFlags::Reflection;
            pdfSum += enteredTop ? config.nSamples * top.PDF(wo, wi, mode, reflFlag)
                                 : config.nSamples * bottom.PDF(wo, wi, mode, reflFlag);
        }

        for (int s = 0; s < config.nSamples; ++s) {
            // Evaluate layered BSDF PDF sample
            if (SameHemisphere(wo, wi)) {
                // Evaluate TRT term for PDF estimate
                TopOrBottomBxDF<TopBxDF, BottomBxDF> rInterface, tInterface;
                if (enteredTop) {
                    rInterface = &bottom;
                    tInterface = &top;
                } else {
                    rInterface = &top;
                    tInterface = &bottom;
                }
                // Sample _tInterface_ to get direction into the layers
                auto trans = BxDFReflTransFlags::Transmission;
                pstd::optional<BSDFSample> wos, wis;
                wos = tInterface.Sample_f(wo, r(), {r(), r()}, mode, trans);
                wis = tInterface.Sample_f(wi, r(), {r(), r()}, !mode, trans);

                // Update _pdfSum_ accounting for TRT scattering events
                if (wos && wos->f && wos->pdf > 0 && wis && wis->f && wis->pdf > 0) {
                    if (!tInterface.IsNonSpecular())
                        pdfSum += rInterface.PDF(-wos->wi, -wis->wi, mode);
                    else {
                        // Use multiple importance sampling to estimate PDF product
                        pstd::optional<BSDFSample> rs =
                            rInterface.Sample_f(-wos->wi, r(), {r(), r()}, mode);
                        if (!rs || !rs->f || rs->pdf == 0)
                            ;
                        else if (!rInterface.IsNonSpecular())
                            pdfSum += tInterface.PDF(-rs->wi, wi, mode);
                        else {
                            // Actual MIS here
                            // first, sample r -> r cancels
                            Float tPDF = tInterface.PDF(-rs->wi, wi, mode);
                            Float wt = PowerHeuristic(1, rs->pdf, 1, tPDF);
                            pdfSum += wt * tPDF;

                            Float rPDF = rInterface.PDF(-wos->wi, -wis->wi, mode);
                            wt = PowerHeuristic(1, wis->pdf, 1, rPDF);
                            pdfSum += wt * rPDF;
                        }
                    }
                }

            } else {
                // Evaluate TT term for PDF estimate
                TopOrBottomBxDF<TopBxDF, BottomBxDF> toInterface, tiInterface;
                if (enteredTop) {
                    toInterface = &top;
                    tiInterface = &bottom;
                } else {
                    toInterface = &bottom;
                    tiInterface = &top;
                }

                Float uc = r();
                Point2f u(r(), r());
                pstd::optional<BSDFSample> wos = toInterface.Sample_f(wo, uc, u, mode);
                if (!wos || !wos->f || wos->pdf == 0 || wos->wi.z == 0 ||
                    wos->IsReflection())
                    continue;

                uc = r();
                u = Point2f(r(), r());
                pstd::optional<BSDFSample> wis = tiInterface.Sample_f(wi, uc, u, !mode);
                if (!wis || !wos->f || wos->pdf == 0 || wos->wi.z == 0 ||
                    wis->IsReflection())
                    continue;

                if (IsSpecular(toInterface.Flags()))
                    pdfSum += tiInterface.PDF(-wos->wi, wi, mode);
                else if (IsSpecular(tiInterface.Flags()))
                    pdfSum += toInterface.PDF(wo, -wis->wi, mode);
                else
                    pdfSum += (toInterface.PDF(wo, -wis->wi, mode) +
                               tiInterface.PDF(-wos->wi, wi, mode)) /
                              2;
            }
        }
        // Return mixture of PDF estimate and constant PDF
        return Lerp(0.9f, 1 / (4 * Pi), pdfSum / config.nSamples);
    }